

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void checkPtrmap(IntegrityCk *pCheck,Pgno iChild,u8 eType,Pgno iParent)

{
  int iVar1;
  u8 ePtrmapType;
  Pgno iPtrmapParent;
  byte local_25;
  Pgno local_24;
  
  iVar1 = ptrmapGet(pCheck->pBt,iChild,&local_25,&local_24);
  if (iVar1 == 0) {
    if (local_25 != eType || local_24 != iParent) {
      checkAppendMsg(pCheck,"Bad ptr map entry key=%d expected=(%d,%d) got=(%d,%d)",iChild,
                     (ulong)eType,(ulong)iParent,(ulong)local_25,local_24);
    }
  }
  else {
    if ((iVar1 == 0xc0a) || (iVar1 == 7)) {
      pCheck->mallocFailed = 1;
    }
    checkAppendMsg(pCheck,"Failed to read ptrmap key=%d",iChild);
  }
  return;
}

Assistant:

static void checkPtrmap(
  IntegrityCk *pCheck,   /* Integrity check context */
  Pgno iChild,           /* Child page number */
  u8 eType,              /* Expected pointer map type */
  Pgno iParent           /* Expected pointer map parent page number */
){
  int rc;
  u8 ePtrmapType;
  Pgno iPtrmapParent;

  rc = ptrmapGet(pCheck->pBt, iChild, &ePtrmapType, &iPtrmapParent);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ) pCheck->mallocFailed = 1;
    checkAppendMsg(pCheck, "Failed to read ptrmap key=%d", iChild);
    return;
  }

  if( ePtrmapType!=eType || iPtrmapParent!=iParent ){
    checkAppendMsg(pCheck,
      "Bad ptr map entry key=%d expected=(%d,%d) got=(%d,%d)", 
      iChild, eType, iParent, ePtrmapType, iPtrmapParent);
  }
}